

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O0

LispPTR vmem_save(char *sysout_file_name)

{
  uint uVar1;
  LispPTR *pLVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  __off_t _Var7;
  DLword *page;
  ssize_t sVar8;
  bool bVar9;
  uint local_106c;
  uint oldTT;
  uint pc;
  DLword *ba;
  DLword *base_addr;
  uint contig_pages;
  uint saveoldfptovp;
  uint oldfptovp;
  int rval;
  off_t roff;
  ssize_t rsize;
  char tempname [4096];
  int local_30;
  int i;
  int vmemsize;
  uint *fptovp;
  int sysout;
  char *sysout_file_name_local;
  
  pLVar2 = FPtoVP;
  iVar5 = InterfacePage->nactivepages;
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 == 0) {
    sprintf((char *)&rsize,"%s-temp",sysout_file_name);
    alarm(TIMEOUT_TIME);
    do {
      piVar6 = __errno_location();
      *piVar6 = 0;
      iVar3 = open(sysout_file_name,1,0x1b6);
      bVar9 = false;
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        bVar9 = *piVar6 == 4;
      }
    } while (bVar9);
    alarm(0);
    if (iVar3 == -1) {
      piVar6 = __errno_location();
      if (*piVar6 != 2) {
        return 0xe0003;
      }
    }
    else {
      alarm(TIMEOUT_TIME);
      do {
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar4 = close(iVar3);
        bVar9 = false;
        if (iVar4 == -1) {
          piVar6 = __errno_location();
          bVar9 = *piVar6 == 4;
        }
      } while (bVar9);
      alarm(0);
    }
    alarm(TIMEOUT_TIME);
    do {
      piVar6 = __errno_location();
      *piVar6 = 0;
      iVar3 = open((char *)&rsize,0x241,0x1b6);
      bVar9 = false;
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        bVar9 = *piVar6 == 4;
      }
    } while (bVar9);
    alarm(0);
    if (iVar3 == -1) {
      piVar6 = __errno_location();
      err_mess("open",*piVar6);
      sysout_file_name_local._4_4_ = 0xe0003;
    }
    else {
      InterfacePage->machinetype = 3;
      if ((*STORAGEFULLSTATE_word & 0xffff) == 1) {
        *STORAGEFULLSTATE_word = 0;
        InterfacePage->storagefullstate = 0;
      }
      else {
        InterfacePage->storagefullstate = (DLword)*STORAGEFULLSTATE_word;
      }
      for (local_30 = 0; local_30 < iVar5; local_30 = local_30 + 1) {
        if (pLVar2[(long)local_30 + 1] >> 0x10 != 0xffff) {
          contig_pages = pLVar2[(long)local_30 + 1];
          base_addr._0_4_ = 0;
          alarm(TIMEOUT_TIME);
          do {
            piVar6 = __errno_location();
            *piVar6 = 0;
            _Var7 = lseek(iVar3,(long)(local_30 << 9),0);
            bVar9 = false;
            if (_Var7 == -1) {
              piVar6 = __errno_location();
              bVar9 = *piVar6 == 4;
            }
          } while (bVar9);
          alarm(0);
          if (_Var7 == -1) {
            piVar6 = __errno_location();
            err_mess("lseek",*piVar6);
            return 0xe0004;
          }
          page = Lisp_world + (pLVar2[(long)local_30 + 1] << 8);
          for (; pLVar2[(long)local_30 + 1] == contig_pages && local_30 < iVar5;
              contig_pages = contig_pages + 1) {
            base_addr._0_4_ = (uint)base_addr + 1;
            local_30 = local_30 + 1;
          }
          local_30 = local_30 + -1;
          word_swap_page(page,(uint)base_addr << 7);
          uVar1 = TIMEOUT_TIME;
          if (maxpages < (uint)base_addr) {
            _oldTT = page;
            for (local_106c = (uint)base_addr; maxpages < local_106c;
                local_106c = local_106c - maxpages) {
              alarm(TIMEOUT_TIME);
              do {
                piVar6 = __errno_location();
                *piVar6 = 0;
                roff = write(iVar3,_oldTT,(ulong)maxpages << 9);
                bVar9 = false;
                if (roff == -1) {
                  piVar6 = __errno_location();
                  bVar9 = *piVar6 == 4;
                }
              } while (bVar9);
              alarm(0);
              if (roff == -1) {
                piVar6 = __errno_location();
                err_mess("write",*piVar6);
                piVar6 = __errno_location();
                bVar9 = true;
                if (*piVar6 != 0x1c) {
                  piVar6 = __errno_location();
                  bVar9 = *piVar6 == 0x7a;
                }
                if (!bVar9) {
                  return 0xe0005;
                }
                return 0xe0002;
              }
              _oldTT = _oldTT + (maxpages << 8);
            }
            if (local_106c != 0) {
              alarm(TIMEOUT_TIME);
              do {
                piVar6 = __errno_location();
                *piVar6 = 0;
                roff = write(iVar3,_oldTT,(ulong)(local_106c << 9));
                bVar9 = false;
                if (roff == -1) {
                  piVar6 = __errno_location();
                  bVar9 = *piVar6 == 4;
                }
              } while (bVar9);
              alarm(0);
            }
          }
          else {
            TIMEOUT_TIME = ((uint)base_addr >> 3) + TIMEOUT_TIME;
            alarm(TIMEOUT_TIME);
            do {
              piVar6 = __errno_location();
              *piVar6 = 0;
              roff = write(iVar3,page,(ulong)((uint)base_addr << 9));
              bVar9 = false;
              if (roff == -1) {
                piVar6 = __errno_location();
                bVar9 = *piVar6 == 4;
              }
            } while (bVar9);
            alarm(0);
            TIMEOUT_TIME = uVar1;
          }
          word_swap_page(page,(uint)base_addr << 7);
          if (roff == -1) {
            piVar6 = __errno_location();
            err_mess("write",*piVar6);
            piVar6 = __errno_location();
            bVar9 = true;
            if (*piVar6 != 0x1c) {
              piVar6 = __errno_location();
              bVar9 = *piVar6 == 0x7a;
            }
            if (!bVar9) {
              return 0xe0005;
            }
            return 0xe0002;
          }
        }
      }
      alarm(TIMEOUT_TIME);
      do {
        piVar6 = __errno_location();
        *piVar6 = 0;
        _Var7 = lseek(iVar3,0x200,0);
        bVar9 = false;
        if (_Var7 == -1) {
          piVar6 = __errno_location();
          bVar9 = *piVar6 == 4;
        }
      } while (bVar9);
      alarm(0);
      if (_Var7 == -1) {
        piVar6 = __errno_location();
        err_mess("lseek",*piVar6);
        sysout_file_name_local._4_4_ = 0xe0004;
      }
      else {
        word_swap_page(InterfacePage,0x80);
        alarm(TIMEOUT_TIME);
        do {
          piVar6 = __errno_location();
          *piVar6 = 0;
          sVar8 = write(iVar3,InterfacePage,0x200);
          bVar9 = false;
          if (sVar8 == -1) {
            piVar6 = __errno_location();
            bVar9 = *piVar6 == 4;
          }
        } while (bVar9);
        alarm(0);
        word_swap_page(InterfacePage,0x80);
        if (sVar8 == -1) {
          piVar6 = __errno_location();
          err_mess("write",*piVar6);
          piVar6 = __errno_location();
          bVar9 = true;
          if (*piVar6 != 0x1c) {
            piVar6 = __errno_location();
            bVar9 = *piVar6 == 0x7a;
          }
          sysout_file_name_local._4_4_ = 0xe0005;
          if (bVar9) {
            sysout_file_name_local._4_4_ = 0xe0002;
          }
        }
        else {
          alarm(TIMEOUT_TIME);
          do {
            piVar6 = __errno_location();
            *piVar6 = 0;
            iVar5 = close(iVar3);
            bVar9 = false;
            if (iVar5 == -1) {
              piVar6 = __errno_location();
              bVar9 = *piVar6 == 4;
            }
          } while (bVar9);
          alarm(0);
          if (iVar5 == -1) {
            sysout_file_name_local._4_4_ = 0xe0005;
          }
          else {
            alarm(TIMEOUT_TIME);
            do {
              piVar6 = __errno_location();
              *piVar6 = 0;
              iVar5 = unlink(sysout_file_name);
              bVar9 = false;
              if (iVar5 == -1) {
                piVar6 = __errno_location();
                bVar9 = *piVar6 == 4;
              }
            } while (bVar9);
            alarm(0);
            if ((iVar5 == -1) && (piVar6 = __errno_location(), *piVar6 != 2)) {
              sysout_file_name_local._4_4_ = 0xe0003;
            }
            else {
              alarm(TIMEOUT_TIME);
              do {
                piVar6 = __errno_location();
                *piVar6 = 0;
                iVar5 = rename((char *)&rsize,sysout_file_name);
                bVar9 = false;
                if (iVar5 == -1) {
                  piVar6 = __errno_location();
                  bVar9 = *piVar6 == 4;
                }
              } while (bVar9);
              alarm(0);
              if (iVar5 == -1) {
                fprintf(_stderr,"sysout is saved to temp file, %s.",&rsize);
                sysout_file_name_local._4_4_ = 0xe0005;
              }
              else {
                sysout_file_name_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  else {
    sysout_file_name_local._4_4_ = 0xe0006;
  }
  return sysout_file_name_local._4_4_;
}

Assistant:

LispPTR vmem_save(char *sysout_file_name)
{
  int sysout; /* SysoutFile descriptor */
#ifdef BIGVM
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif          /* BIGVM */
  int vmemsize; /* VMEMSIZE */
  int i;
  char tempname[MAXPATHLEN];
  ssize_t rsize;
  off_t roff;
  int rval;
#ifndef DOS
  extern int ScreenLocked;
  extern DLword *EmCursorX68K;
  extern DLword *EmCursorY68K;
  extern DLword NullCursor[];
  extern DLword *EmCursorBitMap68K;
#endif /* DOS */

/* remove cursor image from screen */

#ifdef   DOS
  /*  For DOS, must also take the mouse cursor away (it's  */
  /*  written into the display-region bitmap).	     */
  currentdsp->device.locked++;
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#endif /* SUNDISPLAY || DOS */

  /* set FPTOVP */
  fptovp = FPtoVP + 1;

  /* set VMEMSIZE */
  vmemsize = InterfacePage->nactivepages;

  /*	[HH:6-Jan-89]
          Sequence of save image
          (1) Sysout image is saved to a temporary file, tempname.
          (2) if a specified file, sysout_file_name, is exist, the file is removed.
          (3) the temporary file is renamed to the specified file.
  */

  SETJMP(FILETIMEOUT);
#ifdef DOS
  /* Bloddy 8 char filenames in dos ... /jarl */
  make_old_version(tempname, sysout_file_name);
#else  /* DOS */
  sprintf(tempname, "%s-temp", sysout_file_name);
#endif /* DOS */

  /* Confirm protection of specified file by open/close */

  TIMEOUT(sysout = open(sysout_file_name, O_WRONLY, 0666));
  if (sysout == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) return (FILECANNOTOPEN); /* No such file error.*/
  } else
    TIMEOUT(rval = close(sysout));

  /* open temp file */
  TIMEOUT(sysout = open(tempname, O_WRONLY | O_CREAT | O_TRUNC, 0666));
  if (sysout == -1) {
    err_mess("open", errno);
    return (FILECANNOTOPEN);
  }

  InterfacePage->machinetype = MACHINETYPE_MAIKO;

  /* Restore storagefull state */
  if (((*STORAGEFULLSTATE_word) & 0xffff) == SFS_NOTSWITCHABLE) {
    /* This sysout uses only 8 Mbyte lisp space.
       It may be able to use this SYSOUT which has more than
       8 Mbyte lisp space.
       To enable to expand lisp space, \\STORAGEFULLSTATE
       should be NIL.
    */
    *STORAGEFULLSTATE_word = NIL;
    InterfacePage->storagefullstate = NIL;
  } else {
    /*  Otherwise, just restore storagefullstate in IFPAGE */
    InterfacePage->storagefullstate = (*STORAGEFULLSTATE_word) & 0xffff;
  }

/* First, sort fptovp table, trying to get pages contiguous */
#ifndef BIGVM
#ifndef BYTESWAP
  /* Byte-swapped machines don't sort the table right. */
  sort_fptovp(fptovp, vmemsize);
#endif
#endif

  /* store vmem to sysoutfile */

  for (i = 0; i < vmemsize; i++) {
    if (GETPAGEOK(fptovp, i) != 0177777) {
      unsigned int oldfptovp = GETFPTOVP(fptovp, i);
      unsigned int saveoldfptovp = oldfptovp;
      unsigned int contig_pages = 0;
      DLword *base_addr;

      TIMEOUT(roff = lseek(sysout, i * BYTESPER_PAGE, SEEK_SET));
      if (roff == -1) {
        err_mess("lseek", errno);
        return (FILECANNOTSEEK);
      }
      base_addr = Lisp_world + (GETFPTOVP(fptovp, i) * DLWORDSPER_PAGE);

      /* Now, let's see how many pages we can dump */
      while (GETFPTOVP(fptovp, i) == oldfptovp && i < vmemsize) {
        contig_pages++; oldfptovp++; i++;
      }
      i--; /* Previous loop always overbumps i */
      DBPRINT(("%4d: writing %d pages from %tx (%d)\n", i, contig_pages, (char *)base_addr - (char *)Lisp_world, saveoldfptovp));

#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (contig_pages > maxpages) {
        DLword *ba = base_addr;
        unsigned int pc = contig_pages;
        while (pc > maxpages) {
          TIMEOUT(rsize = write(sysout, ba, (size_t)maxpages * BYTESPER_PAGE));
          if (rsize == -1) {
            err_mess("write", errno);
            return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
          }
          ba += maxpages * DLWORDSPER_PAGE;
          pc -= maxpages;
        }
        if (pc > 0) TIMEOUT(rsize = write(sysout, ba, pc * BYTESPER_PAGE));
      } else {
        unsigned int oldTT = TIMEOUT_TIME;
        /* As we can spend longer than TIMEOUT_TIME doing a big
           write, we adjust the timeout temporarily here */
        TIMEOUT_TIME += contig_pages >> 3;
        TIMEOUT(rsize = write(sysout, base_addr, contig_pages * BYTESPER_PAGE));
        TIMEOUT_TIME = oldTT;
      }
#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (rsize == -1) {
        err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
      }
    }
  }

  /* seek to IFPAGE */
  TIMEOUT(roff = lseek(sysout, (long)FP_IFPAGE, SEEK_SET));
  if (roff == -1) {
    err_mess("lseek", errno);
    return (FILECANNOTSEEK);
  }
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  TIMEOUT(rsize = write(sysout, (char *)InterfacePage, BYTESPER_PAGE));
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  if (rsize == -1) {
    err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
  }

#ifdef OS5
  /* Seems to write all pages at close, so timeout
     is WAY to short, no matter how big.  JDS 960925 */
  rval = close(sysout);
#else
  TIMEOUT(rval = close(sysout));
#endif /* OS5 */
  if (rval == -1) { return (FILECANNOTWRITE); }

  TIMEOUT(rval = unlink(sysout_file_name));
  if (rval == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) /* No such file error.*/
      return (FILECANNOTOPEN);
  }

  TIMEOUT(rval = rename(tempname, sysout_file_name));
  if (rval == -1) {
    (void)fprintf(stderr, "sysout is saved to temp file, %s.", tempname);
    return (FILECANNOTWRITE);
  }

/* restore cursor image to screen */
#ifdef DOS
  /* Must also put the mouse back. */
  (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
  currentdsp->device.locked--;

#endif /* SUNDISPLAY */

  /*printf("vmem is saved completely.\n");*/
  return (COMPLETESYSOUT);
}